

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O3

vector<Vec2,_std::allocator<Vec2>_> * __thiscall
Router::Route(vector<Vec2,_std::allocator<Vec2>_> *__return_storage_ptr__,Router *this,Vec2 start,
             Vec2 end)

{
  pointer *ppVVar1;
  uint uVar2;
  pointer pVVar3;
  long lVar4;
  iterator __position;
  pointer pVVar5;
  Vec2 VVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  Vec2 *pVVar10;
  long lVar11;
  pointer pVVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  bool used [100];
  float dis [100];
  Vec2 vertex [100];
  int prev [100];
  float edges [100] [100];
  ulong local_a380;
  float local_a378;
  float fStack_a374;
  ulong local_a368;
  float local_a358;
  float fStack_a354;
  Vec2 local_a330;
  char acStack_a328 [112];
  float afStack_a2b8 [100];
  Vec2 local_a128 [100];
  uint auStack_9e08 [100];
  float local_9c78 [10002];
  
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a330 = end;
  bVar7 = Reachable(this,end);
  if (bVar7) {
    local_a358 = end.x;
    fStack_a354 = end.y;
    local_a378 = start.x;
    fStack_a374 = start.y;
    if (0.0001 <= SQRT((local_a358 - local_a378) * (local_a358 - local_a378) +
                       (fStack_a354 - fStack_a374) * (fStack_a354 - fStack_a374))) {
      uVar2 = this->VertexCount;
      lVar15 = (long)(int)uVar2;
      memset(local_a128,0,800);
      if (0 < lVar15) {
        pVVar3 = (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = 0;
        do {
          local_a128[lVar11] = pVVar3[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar15 != lVar11);
      }
      local_a128[lVar15] = start;
      local_a128[lVar15 + 1] = end;
      local_a380 = 1;
      if (-2 < (int)uVar2) {
        uVar13 = uVar2 + 2;
        local_a380 = 1;
        if (1 < (int)uVar13) {
          local_a380 = (ulong)uVar13;
        }
        local_a368 = 1;
        uVar9 = 0;
        do {
          auStack_9e08[uVar9] = 0xffffffff;
          acStack_a328[uVar9] = '\0';
          fVar18 = 0.0;
          if (uVar9 != (uint)this->VertexCount) {
            fVar18 = 1e+08;
          }
          afStack_a2b8[uVar9] = fVar18;
          local_9c78[uVar9 * 0x65] = 0.0;
          uVar14 = uVar9 + 1;
          uVar16 = local_a368;
          if ((long)uVar14 < (long)(int)uVar13) {
            do {
              if ((long)uVar9 < (long)this->VertexCount && (long)uVar16 < (long)this->VertexCount) {
                fVar18 = *(float *)(*(long *)&(this->Edges).
                                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data + uVar16 * 4);
              }
              else {
                if (0 < this->ObstacleCount) {
                  lVar11 = 0;
                  do {
                    lVar17 = 1;
                    while (lVar17 != 5) {
                      lVar4 = *(long *)&(this->Obstacles).
                                        super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                        super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                                        super__Vector_impl_data;
                      bVar7 = intersect(local_a128[uVar9],local_a128[uVar16],
                                        *(Vec2 *)(lVar4 + -8 + lVar17 * 8),
                                        *(Vec2 *)(lVar4 + (ulong)((uint)lVar17 & 3) * 8));
                      lVar17 = lVar17 + 1;
                      if (bVar7) {
                        fVar18 = 1e+08;
                        goto LAB_00106419;
                      }
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < this->ObstacleCount);
                }
                fVar18 = local_a128[uVar9].x - local_a128[uVar16].x;
                fVar19 = local_a128[uVar9].y - local_a128[uVar16].y;
                fVar18 = SQRT(fVar18 * fVar18 + fVar19 * fVar19);
              }
LAB_00106419:
              local_9c78[uVar16 * 100 + uVar9] = fVar18;
              local_9c78[uVar9 * 100 + uVar16] = fVar18;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar13);
          }
          local_a368 = local_a368 + 1;
          uVar9 = uVar14;
        } while (uVar14 != local_a380);
      }
      uVar9 = lVar15 + 1;
      if (-2 < (int)uVar2) {
        uVar13 = 0xffffffff;
        uVar14 = 0;
        do {
          do {
            if ((acStack_a328[uVar14] == '\0') &&
               ((uVar13 == 0xffffffff ||
                (afStack_a2b8[uVar14] <= afStack_a2b8[(int)uVar13] &&
                 afStack_a2b8[(int)uVar13] != afStack_a2b8[uVar14])))) {
              uVar13 = (uint)uVar14;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_a380);
          if (uVar13 == 0xffffffff) break;
          lVar15 = (long)(int)uVar13;
          acStack_a328[lVar15] = '\x01';
          if ((int)uVar2 < -1) break;
          uVar14 = 0;
          do {
            if (afStack_a2b8[lVar15] + local_9c78[lVar15 * 100 + uVar14] < afStack_a2b8[uVar14]) {
              afStack_a2b8[uVar14] = afStack_a2b8[lVar15] + local_9c78[lVar15 * 100 + uVar14];
              auStack_9e08[uVar14] = uVar13;
            }
            uVar14 = uVar14 + 1;
          } while (local_a380 != uVar14);
          uVar14 = 0;
          uVar13 = 0xffffffff;
        } while (-2 < (int)uVar2);
      }
      do {
        iVar8 = (int)uVar9;
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)__return_storage_ptr__,__position,
                     local_a128 + iVar8);
        }
        else {
          *__position._M_current = local_a128[iVar8];
          ppVVar1 = &(__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        uVar9 = (ulong)auStack_9e08[iVar8];
      } while (auStack_9e08[iVar8] != uVar2);
      pVVar3 = (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pVVar5 = (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar12 = pVVar5 + -1;
      if (pVVar3 < pVVar12 && pVVar3 != pVVar5) {
        do {
          pVVar10 = pVVar3 + 1;
          VVar6 = *pVVar3;
          *pVVar3 = *pVVar12;
          *pVVar12 = VVar6;
          pVVar12 = pVVar12 + -1;
          pVVar3 = pVVar10;
        } while (pVVar10 < pVVar12);
      }
    }
    else {
      std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                ((vector<Vec2,std::allocator<Vec2>> *)__return_storage_ptr__,(iterator)0x0,
                 &local_a330);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2> Router::Route(Vec2 start, Vec2 end)
{
    std::vector<Vec2> res;
    if (!Reachable(end))
        return res;
    if ((end - start).length() < EPS)
    {
        res.push_back(end);
        return res;
    }

    int Points = VertexCount;

    float dis[MAX_POINTS];					//起点到该点的最短距离
	float edges[MAX_POINTS][MAX_POINTS];    //边权
	Vec2 vertex[MAX_POINTS];			    //参与最短路计算的点的坐标
	int prev[MAX_POINTS];					//点的前驱，回溯最短路用
	bool used[MAX_POINTS];                  //点是否已松弛过

    for (int i = 0; i < Points; ++i)
        vertex[i] = Vertexes[i];
    vertex[Points++] = start;
    vertex[Points++] = end;

    for (int i = 0; i < Points; ++i)
    {
        prev[i] = -1;
        used[i] = false;
        dis[i] = (i == VertexCount ? 0 : FINF);
        edges[i][i] = 0;
        for (int j = i + 1; j < Points; ++j)
        {
            if (i < VertexCount && j < VertexCount)
            {
                edges[i][j] = edges[j][i] = Edges[i][j];
                continue;
            }
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(vertex[i], vertex[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
						flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            edges[i][j] = edges[j][i] = (flag ? (vertex[i] - vertex[j]).length() : FINF);
        }
    }

    //Dijkstra
    while (true)
    {
        int v = -1;
        for (int i = 0; i < Points; ++i)
            if (!used[i] && (v == -1 || dis[i] < dis[v]))
                v = i;
		if (v == -1)
            break;
        used[v] = true;
        for (int i = 0; i < Points; ++i)
            if (dis[i] > dis[v] + edges[v][i])
            {
                dis[i] = dis[v] + edges[v][i];
                prev[i] = v;
            }
    }

	for (int i = Points - 1; i != Points - 2; i = prev[i])
        res.push_back(vertex[i]);
    reverse(res.begin(), res.end());
    return res;
}